

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void __thiscall VmValue::RemoveUse(VmValue *this,VmValue *user)

{
  SmallArray<VmConstant_*,_8U> *this_00;
  char *pcVar1;
  VmBlock *this_01;
  VmConstant *pVVar2;
  ulong uVar3;
  bool bVar4;
  VmValue **ppVVar5;
  VmConstant **ppVVar6;
  ulong uVar7;
  uint uVar8;
  int local_34;
  VmConstant *local_30;
  
  uVar8 = (this->users).count;
  uVar3 = 0;
  do {
    uVar7 = uVar3;
    if (uVar8 == uVar7) goto LAB_001855e7;
    uVar3 = uVar7 + 1;
  } while ((this->users).data[uVar7] != user);
  ppVVar5 = SmallArray<VmValue_*,_8U>::back(&this->users);
  (this->users).data[uVar7] = *ppVVar5;
  SmallArray<VmValue_*,_8U>::pop_back(&this->users);
  this->hasKnownNonSimpleUse = false;
  uVar8 = (this->users).count;
LAB_001855e7:
  if (((uVar8 == 0) && (this->hasSideEffects == false)) && (this->canBeRemoved == true)) {
    switch(this->typeID) {
    case 1:
      pcVar1 = this[1].comment.end;
      if (pcVar1 != (char *)0x0) {
        this_00 = (SmallArray<VmConstant_*,_8U> *)(pcVar1 + 0x48);
        uVar8 = 0;
        while( true ) {
          if (*(uint *)(pcVar1 + 0x50) <= uVar8) {
            __assert_fail("found",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x79a,"void VmValue::RemoveUse(VmValue *)");
          }
          ppVVar6 = SmallArray<VmConstant_*,_8U>::operator[](this_00,uVar8);
          if (*ppVVar6 == (VmConstant *)this) break;
          uVar8 = uVar8 + 1;
        }
        ppVVar6 = SmallArray<VmConstant_*,_8U>::back(this_00);
        pVVar2 = *ppVVar6;
        ppVVar6 = SmallArray<VmConstant_*,_8U>::operator[](this_00,uVar8);
        *ppVVar6 = pVVar2;
        SmallArray<VmConstant_*,_8U>::pop_back(this_00);
        local_34 = *(int *)&this[1]._vptr_VmValue + 1;
        local_30 = (VmConstant *)0x0;
        SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
                  ((SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U> *)(pcVar1 + 0xa0),&local_34,
                   &local_30);
      }
      break;
    case 2:
      this_01 = (VmBlock *)this[1].users.data;
      if (this_01 != (VmBlock *)0x0) {
        VmBlock::RemoveInstruction(this_01,(VmInstruction *)this);
        return;
      }
      break;
    case 3:
      bVar4 = VmBlock::HasExternalInstructionUsers((VmBlock *)this);
      if (!bVar4) {
        while (*(VmInstruction **)&this[1].hasSideEffects != (VmInstruction *)0x0) {
          VmBlock::RemoveInstruction((VmBlock *)this,*(VmInstruction **)&this[1].hasSideEffects);
        }
      }
      break;
    case 4:
      break;
    default:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x7b1,"void VmValue::RemoveUse(VmValue *)");
    }
  }
  return;
}

Assistant:

void VmValue::RemoveUse(VmValue* user)
{
	for(unsigned i = 0, e = users.count; i < e; i++)
	{
		if(users.data[i] == user)
		{
			users.data[i] = users.back();
			users.pop_back();

			// Might have removed last non-simple use
			hasKnownNonSimpleUse = false;
			break;
		}
	}

	if(users.count == 0 && !hasSideEffects && canBeRemoved)
	{
		if(VmConstant *constant = getType<VmConstant>(this))
		{
			if(VariableData *container = constant->container)
			{
				bool found = false;

				for(unsigned i = 0; i < container->users.size(); i++)
				{
					if(container->users[i] == constant)
					{
						found = true;

						container->users[i] = container->users.back();
						container->users.pop_back();

						container->offsetUsers.insert(constant->iValue + 1, NULL);
						break;
					}
				}

				(void)found;

				assert(found);
			}
		}
		else if(VmInstruction *instruction = getType<VmInstruction>(this))
		{
			if(instruction->parent)
				instruction->parent->RemoveInstruction(instruction);
		}
		else if(VmBlock *block = getType<VmBlock>(this))
		{
			if(!block->HasExternalInstructionUsers())
			{
				// Remove all block instructions
				while(block->lastInstruction)
					block->RemoveInstruction(block->lastInstruction);
			}
		}
		else if(isType<VmFunction>(this))
		{
			// Do not remove functions
		}
		else
		{
			assert(!"unknown type");
		}
	}
}